

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfogatherer.cpp
# Opt level: O0

void __thiscall
QFileInfoGatherer::fetch
          (QFileInfoGatherer *this,QFileInfo *fileInfo,QElapsedTimer *base,bool *firstTime,
          QList<std::pair<QString,_QFileInfo>_> *updatedFiles,QString *path)

{
  qsizetype qVar1;
  long lVar2;
  byte *in_RCX;
  QElapsedTimer *in_RDX;
  QFileInfoGatherer *in_RDI;
  QList<std::pair<QString,_QFileInfo>_> *in_R8;
  pair<QString,_QFileInfo> *in_R9;
  long in_FS_OFFSET;
  QElapsedTimer current;
  pair<QString,_QFileInfo> *in_stack_ffffffffffffff68;
  QList<std::pair<QString,_QFileInfo>_> *__x;
  QElapsedTimer local_50 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __x = in_R8;
  QFileInfo::fileName();
  std::pair<QString,_QFileInfo>::pair<QString,_true>(in_R9,(QString *)__x,(QFileInfo *)in_RDI);
  QList<std::pair<QString,QFileInfo>>::emplace_back<std::pair<QString,QFileInfo>>
            ((QList<std::pair<QString,_QFileInfo>_> *)in_RDI,in_stack_ffffffffffffff68);
  std::pair<QString,_QFileInfo>::~pair((pair<QString,_QFileInfo> *)in_RDI);
  QString::~QString((QString *)0xa94d94);
  local_50[0].t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_50[0].t2 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QElapsedTimer::QElapsedTimer(local_50);
  QElapsedTimer::start();
  if ((*in_RCX & 1) == 0) {
LAB_00a94dda:
    lVar2 = QElapsedTimer::msecsTo(in_RDX);
    if (lVar2 < 0x3e9) goto LAB_00a94e2d;
  }
  else {
    qVar1 = QList<std::pair<QString,_QFileInfo>_>::size(in_R8);
    if (qVar1 < 0x65) goto LAB_00a94dda;
  }
  updates(in_RDI,&in_stack_ffffffffffffff68->first,(QList<std::pair<QString,_QFileInfo>_> *)0xa94e05
         );
  QList<std::pair<QString,_QFileInfo>_>::clear((QList<std::pair<QString,_QFileInfo>_> *)in_RDI);
  in_RDX->t1 = local_50[0].t1;
  in_RDX->t2 = local_50[0].t2;
  *in_RCX = 0;
LAB_00a94e2d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileInfoGatherer::fetch(const QFileInfo &fileInfo, QElapsedTimer &base, bool &firstTime,
                              QList<std::pair<QString, QFileInfo>> &updatedFiles, const QString &path)
{
    updatedFiles.emplace_back(std::pair(fileInfo.fileName(), fileInfo));
    QElapsedTimer current;
    current.start();
    if ((firstTime && updatedFiles.size() > 100) || base.msecsTo(current) > 1000) {
        emit updates(path, updatedFiles);
        updatedFiles.clear();
        base = current;
        firstTime = false;
    }
}